

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined4 extraout_var;
  string *psVar4;
  reference pbVar5;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool local_32e;
  value_type local_310;
  cmCPackComponent *child;
  string *depend;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  undefined1 local_2e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependsVector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  cmValue local_2a0;
  cmValue depends;
  string *installType;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_268 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  cmValue local_228;
  cmValue installTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  cmValue local_1f8;
  cmValue description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  cmValue local_1c8;
  cmValue groupName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  cmValue local_198;
  cmValue plist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  cmValue local_168;
  cmValue archiveFile;
  string local_158;
  string *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  cmValue local_88;
  cmValue displayName;
  string local_70;
  undefined1 local_50 [8];
  string macroPrefix;
  cmCPackComponent *component;
  bool hasComponent;
  string *name_local;
  string *projectName_local;
  cmCPackGenerator *this_local;
  
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::count(&this->Components,name);
  macroPrefix.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
       ::operator[](&this->Components,name);
  if (sVar3 == 0) {
    cmsys::SystemTools::UpperCase(&local_70,name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "CPACK_COMPONENT_",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::operator=((string *)macroPrefix.field_2._8_8_,(string *)name);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DISPLAY_NAME");
    local_88 = GetOption(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_b0 = local_88.Value;
    bVar1 = cmNonempty(local_88);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_88);
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x20),(string *)psVar4)
      ;
    }
    else {
      std::__cxx11::string::operator=
                ((string *)(macroPrefix.field_2._8_8_ + 0x20),(string *)macroPrefix.field_2._8_8_);
    }
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_HIDDEN");
    bVar1 = IsOn(this,&local_d0);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfd | bVar1 * '\x02';
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_REQUIRED");
    bVar1 = IsOn(this,&local_f0);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfe | bVar1;
    std::__cxx11::string::~string((string *)&local_f0);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DISABLED");
    bVar1 = IsOn(this,&local_110);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfb | bVar1 << 2;
    std::__cxx11::string::~string((string *)&local_110);
    archiveFile.Value._6_1_ = 0;
    archiveFile.Value._5_1_ = 0;
    std::operator+(&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DOWNLOADED");
    bVar1 = IsOn(this,&local_130);
    local_32e = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      archiveFile.Value._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"CPACK_DOWNLOAD_ALL",
                 (allocator<char> *)((long)&archiveFile.Value + 7));
      archiveFile.Value._5_1_ = 1;
      local_138 = (string *)GetOption(this,&local_158);
      local_32e = cmIsOn((cmValue)local_138);
    }
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xf7 | local_32e << 3;
    if ((archiveFile.Value._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_158);
    }
    if ((archiveFile.Value._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&archiveFile.Value + 7));
    }
    std::__cxx11::string::~string((string *)&local_130);
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_ARCHIVE_FILE");
    local_168 = GetOption(this,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    plist.Value = local_168.Value;
    bVar1 = cmNonempty(local_168);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_168);
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x88),(string *)psVar4)
      ;
    }
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_PLIST");
    local_198 = GetOption(this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    groupName.Value = local_198.Value;
    bVar1 = cmNonempty(local_198);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_198);
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0xa8),(string *)psVar4)
      ;
    }
    std::operator+(&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_GROUP");
    local_1c8 = GetOption(this,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    description.Value = local_1c8.Value;
    bVar1 = cmNonempty(local_1c8);
    if (bVar1) {
      psVar4 = cmValue::operator_cast_to_string_(&local_1c8);
      iVar2 = (*this->_vptr_cmCPackGenerator[0x1c])(this,projectName,psVar4);
      *(ulong *)(macroPrefix.field_2._8_8_ + 0x40) = CONCAT44(extraout_var,iVar2);
      std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                 (*(long *)(macroPrefix.field_2._8_8_ + 0x40) + 0x68),
                 (value_type *)((long)&macroPrefix.field_2 + 8));
    }
    else {
      *(undefined8 *)(macroPrefix.field_2._8_8_ + 0x40) = 0;
    }
    std::operator+(&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DESCRIPTION");
    local_1f8 = GetOption(this,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    installTypes.Value = local_1f8.Value;
    bVar1 = cmNonempty(local_1f8);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_1f8);
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x50),(string *)psVar4)
      ;
    }
    std::operator+(&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_INSTALL_TYPES");
    local_228 = GetOption(this,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    installTypesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_228.Value;
    bVar1 = cmNonempty(local_228);
    if (bVar1) {
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_268,local_228,false);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_268);
      installType = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_268);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&installType), bVar1) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        this_00 = (vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *)
                  (macroPrefix.field_2._8_8_ + 0x70);
        iVar2 = (*this->_vptr_cmCPackGenerator[0x1a])(this,projectName,pbVar5);
        depends.Value = (string *)CONCAT44(extraout_var_00,iVar2);
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
        push_back(this_00,(value_type *)&depends);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_268);
    }
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DEPENDS");
    local_2a0 = GetOption(this,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    dependsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2a0.Value;
    bVar1 = cmNonempty(local_2a0);
    if (bVar1) {
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2e0,local_2a0,false);
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2e0);
      depend = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2e0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&depend), bVar1) {
        child = (cmCPackComponent *)
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end3_1);
        iVar2 = (*this->_vptr_cmCPackGenerator[0x1b])(this,projectName,child);
        local_310 = (value_type)CONCAT44(extraout_var_01,iVar2);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                   (macroPrefix.field_2._8_8_ + 200),&local_310);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  (&local_310->ReverseDependencies,(value_type *)((long)&macroPrefix.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e0);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return (cmCPackComponent *)macroPrefix.field_2._8_8_;
}

Assistant:

cmCPackComponent* cmCPackGenerator::GetComponent(
  const std::string& projectName, const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent* component = &this->Components[name];
  if (!hasComponent) {
    // Define the component
    std::string macroPrefix =
      "CPACK_COMPONENT_" + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    cmValue displayName = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (cmNonempty(displayName)) {
      component->DisplayName = *displayName;
    } else {
      component->DisplayName = component->Name;
    }
    component->IsHidden = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded = this->IsOn(macroPrefix + "_DOWNLOADED") ||
      cmIsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    cmValue archiveFile = this->GetOption(macroPrefix + "_ARCHIVE_FILE");
    if (cmNonempty(archiveFile)) {
      component->ArchiveFile = *archiveFile;
    }

    cmValue plist = this->GetOption(macroPrefix + "_PLIST");
    if (cmNonempty(plist)) {
      component->Plist = *plist;
    }

    cmValue groupName = this->GetOption(macroPrefix + "_GROUP");
    if (cmNonempty(groupName)) {
      component->Group = this->GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
    } else {
      component->Group = nullptr;
    }

    cmValue description = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (cmNonempty(description)) {
      component->Description = *description;
    }

    // Determine the installation types.
    cmValue installTypes = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (cmNonempty(installTypes)) {
      std::vector<std::string> installTypesVector =
        cmExpandedList(installTypes);
      for (std::string const& installType : installTypesVector) {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, installType));
      }
    }

    // Determine the component dependencies.
    cmValue depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (cmNonempty(depends)) {
      std::vector<std::string> dependsVector = cmExpandedList(depends);
      for (std::string const& depend : dependsVector) {
        cmCPackComponent* child = this->GetComponent(projectName, depend);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
      }
    }
  }
  return component;
}